

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-capnp.c++
# Opt level: O0

StringTree * __thiscall
capnp::anon_unknown_1::CapnpcCapnpMain::nodeName
          (StringTree *__return_storage_ptr__,CapnpcCapnpMain *this,Schema target,Schema scope,
          Reader brand,Maybe<capnp::InterfaceSchema::Method> *method)

{
  Reader brand_00;
  Reader brand_01;
  bool bVar1;
  bool bVar2;
  Which WVar3;
  mapped_type *__dest;
  uint64_t uVar4;
  size_t sVar5;
  Schema *pSVar6;
  Schema *other;
  size_type sVar7;
  pointer ppVar8;
  Array<kj::StringTree> *pieces;
  StringTree *pSVar9;
  Maybe<capnp::InterfaceSchema::Method> *params_2;
  char (*in_R9) [2];
  Iterator IVar10;
  ArrayPtr<const_char> AVar11;
  ArrayPtr<const_char> local_550;
  Array<kj::StringTree> local_540;
  ArrayPtr<const_char> local_528;
  StringTree local_518;
  StringTree local_4e0;
  anon_class_24_3_0c4199e0 local_4a8;
  Mapper<capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader_&> local_490;
  undefined1 local_488 [8];
  Array<kj::StringTree> bindings;
  uint64_t local_468;
  _Self local_460;
  iterator iter;
  ArrayPtr<const_char> local_450;
  StringTree local_440;
  undefined1 local_401 [9];
  size_t local_3f8;
  StringTree local_3f0;
  undefined1 local_3b8 [8];
  StringTree partStr;
  Reader proto;
  Schema part;
  ArrayBuilder<kj::StringTree> parts;
  uint64_t local_2f8;
  Schema local_2f0;
  Reader local_2e8;
  Reader local_2b0;
  RawBrandedSchema *local_280;
  Reader local_278;
  Schema local_248;
  Schema parent_1;
  Reader local_238;
  Reader local_200;
  RawBrandedSchema *local_1d0;
  Reader local_1c8;
  Schema local_198;
  Schema parent;
  Reader local_188;
  undefined1 local_158 [8];
  Reader scopeBrand;
  undefined1 local_118 [8];
  Iterator __end2;
  undefined1 local_f8 [8];
  Iterator __begin2;
  Reader *__range2;
  map<unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader>_>_>
  scopeBindings;
  undefined1 local_70 [8];
  Vector<capnp::Schema> scopeParts;
  Vector<capnp::Schema> targetPath;
  Maybe<capnp::InterfaceSchema::Method> *method_local;
  CapnpcCapnpMain *this_local;
  Schema scope_local;
  Schema target_local;
  
  params_2 = method;
  this_local = (CapnpcCapnpMain *)scope.raw;
  scope_local = target;
  kj::Vector<capnp::Schema>::Vector((Vector<capnp::Schema> *)&scopeParts.builder.disposer);
  kj::Vector<capnp::Schema>::Vector((Vector<capnp::Schema> *)local_70);
  kj::Vector<capnp::Schema>::add<capnp::Schema&>
            ((Vector<capnp::Schema> *)&scopeParts.builder.disposer,&scope_local);
  std::
  map<unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader>_>_>
  ::map((map<unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader>_>_>
         *)&__range2);
  capnp::schema::Brand::Reader::getScopes((Reader *)&__begin2.index,&brand);
  IVar10 = List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader::begin
                     ((Reader *)&__begin2.index);
  __end2._8_8_ = IVar10.container;
  __begin2.container._0_4_ = IVar10.index;
  local_f8 = (undefined1  [8])__end2._8_8_;
  IVar10 = List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader::end((Reader *)&__begin2.index)
  ;
  scopeBrand._reader._40_8_ = IVar10.container;
  __end2.container._0_4_ = IVar10.index;
  local_118 = (undefined1  [8])scopeBrand._reader._40_8_;
  while (bVar1 = _::
                 IndexingIterator<const_capnp::List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Scope::Reader>
                 ::operator!=((IndexingIterator<const_capnp::List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Scope::Reader>
                               *)local_f8,
                              (IndexingIterator<const_capnp::List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Scope::Reader>
                               *)local_118), bVar1) {
    _::
    IndexingIterator<const_capnp::List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Scope::Reader>
    ::operator*((Reader *)local_158,
                (IndexingIterator<const_capnp::List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Scope::Reader>
                 *)local_f8);
    WVar3 = capnp::schema::Brand::Scope::Reader::which((Reader *)local_158);
    if (WVar3 == BIND) {
      capnp::schema::Brand::Scope::Reader::getBind(&local_188,(Reader *)local_158);
      parent.raw = (RawBrandedSchema *)
                   capnp::schema::Brand::Scope::Reader::getScopeId((Reader *)local_158);
      __dest = std::
               map<unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader>_>_>
               ::operator[]((map<unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader>_>_>
                             *)&__range2,(key_type *)&parent);
      memcpy(__dest,&local_188,0x30);
    }
    _::
    IndexingIterator<const_capnp::List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Scope::Reader>
    ::operator++((IndexingIterator<const_capnp::List<capnp::schema::Brand::Scope,_(capnp::Kind)3>::Reader,_capnp::schema::Brand::Scope::Reader>
                  *)local_f8);
  }
  local_198.raw = scope_local.raw;
  while( true ) {
    Schema::getProto(&local_1c8,&local_198);
    uVar4 = capnp::schema::Node::Reader::getScopeId(&local_1c8);
    if (uVar4 == 0) break;
    Schema::getProto(&local_200,&local_198);
    uVar4 = capnp::schema::Node::Reader::getScopeId(&local_200);
    local_238._reader.dataSize = 0;
    local_238._reader.pointerCount = 0;
    local_238._reader._38_2_ = 0;
    local_238._reader.nestingLimit = 0;
    local_238._reader._44_4_ = 0;
    local_238._reader.data = (void *)0x0;
    local_238._reader.pointers = (WirePointer *)0x0;
    local_238._reader.segment = (SegmentReader *)0x0;
    local_238._reader.capTable = (CapTableReader *)0x0;
    capnp::schema::Brand::Reader::Reader(&local_238);
    Schema::Schema(&parent_1);
    brand_00._reader.capTable = local_238._reader.capTable;
    brand_00._reader.segment = local_238._reader.segment;
    brand_00._reader.data = local_238._reader.data;
    brand_00._reader.pointers = local_238._reader.pointers;
    brand_00._reader.dataSize = local_238._reader.dataSize;
    brand_00._reader.pointerCount = local_238._reader.pointerCount;
    brand_00._reader._38_2_ = local_238._reader._38_2_;
    brand_00._reader.nestingLimit = local_238._reader.nestingLimit;
    brand_00._reader._44_4_ = local_238._reader._44_4_;
    local_1d0 = (RawBrandedSchema *)SchemaLoader::get(&this->schemaLoader,uVar4,brand_00,parent_1);
    local_198 = (Schema)local_1d0;
    kj::Vector<capnp::Schema>::add<capnp::Schema&>
              ((Vector<capnp::Schema> *)&scopeParts.builder.disposer,&local_198);
  }
  local_248.raw = (RawBrandedSchema *)this_local;
  kj::Vector<capnp::Schema>::add<capnp::Schema&>((Vector<capnp::Schema> *)local_70,&local_248);
  while( true ) {
    Schema::getProto(&local_278,&local_248);
    uVar4 = capnp::schema::Node::Reader::getScopeId(&local_278);
    if (uVar4 == 0) break;
    Schema::getProto(&local_2b0,&local_248);
    uVar4 = capnp::schema::Node::Reader::getScopeId(&local_2b0);
    local_2e8._reader.dataSize = 0;
    local_2e8._reader.pointerCount = 0;
    local_2e8._reader._38_2_ = 0;
    local_2e8._reader.nestingLimit = 0;
    local_2e8._reader._44_4_ = 0;
    local_2e8._reader.data = (void *)0x0;
    local_2e8._reader.pointers = (WirePointer *)0x0;
    local_2e8._reader.segment = (SegmentReader *)0x0;
    local_2e8._reader.capTable = (CapTableReader *)0x0;
    capnp::schema::Brand::Reader::Reader(&local_2e8);
    Schema::Schema(&local_2f0);
    brand_01._reader.capTable = local_2e8._reader.capTable;
    brand_01._reader.segment = local_2e8._reader.segment;
    brand_01._reader.data = local_2e8._reader.data;
    brand_01._reader.pointers = local_2e8._reader.pointers;
    brand_01._reader.dataSize = local_2e8._reader.dataSize;
    brand_01._reader.pointerCount = local_2e8._reader.pointerCount;
    brand_01._reader._38_2_ = local_2e8._reader._38_2_;
    brand_01._reader.nestingLimit = local_2e8._reader.nestingLimit;
    brand_01._reader._44_4_ = local_2e8._reader._44_4_;
    local_280 = (RawBrandedSchema *)SchemaLoader::get(&this->schemaLoader,uVar4,brand_01,local_2f0);
    local_248 = (Schema)local_280;
    kj::Vector<capnp::Schema>::add<capnp::Schema&>((Vector<capnp::Schema> *)local_70,&local_248);
  }
  while( true ) {
    bVar2 = kj::Vector<capnp::Schema>::empty((Vector<capnp::Schema> *)local_70);
    bVar1 = false;
    if (!bVar2) {
      sVar5 = kj::Vector<capnp::Schema>::size((Vector<capnp::Schema> *)&scopeParts.builder.disposer)
      ;
      bVar1 = false;
      if (1 < sVar5) {
        pSVar6 = kj::Vector<capnp::Schema>::back((Vector<capnp::Schema> *)local_70);
        other = kj::Vector<capnp::Schema>::back
                          ((Vector<capnp::Schema> *)&scopeParts.builder.disposer);
        bVar2 = Schema::operator==(pSVar6,other);
        bVar1 = false;
        if (bVar2) {
          pSVar6 = kj::Vector<capnp::Schema>::back((Vector<capnp::Schema> *)local_70);
          Schema::getProto((Reader *)&parts.disposer,pSVar6);
          local_2f8 = capnp::schema::Node::Reader::getId((Reader *)&parts.disposer);
          sVar7 = std::
                  map<unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader>_>_>
                  ::count((map<unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader>_>_>
                           *)&__range2,&local_2f8);
          bVar1 = sVar7 == 0;
        }
      }
    }
    if (!bVar1) break;
    kj::Vector<capnp::Schema>::removeLast((Vector<capnp::Schema> *)local_70);
    kj::Vector<capnp::Schema>::removeLast((Vector<capnp::Schema> *)&scopeParts.builder.disposer);
  }
  sVar5 = kj::Vector<capnp::Schema>::size((Vector<capnp::Schema> *)&scopeParts.builder.disposer);
  kj::heapArrayBuilder<kj::StringTree>((ArrayBuilder<kj::StringTree> *)&part,sVar5);
  while( true ) {
    bVar1 = kj::Vector<capnp::Schema>::empty((Vector<capnp::Schema> *)&scopeParts.builder.disposer);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pSVar6 = kj::Vector<capnp::Schema>::back((Vector<capnp::Schema> *)&scopeParts.builder.disposer);
    proto._reader._40_8_ = pSVar6->raw;
    Schema::getProto((Reader *)&partStr.branches.disposer,(Schema *)&proto._reader.nestingLimit);
    kj::StringTree::StringTree((StringTree *)local_3b8);
    uVar4 = capnp::schema::Node::Reader::getScopeId((Reader *)&partStr.branches.disposer);
    if (uVar4 == 0) {
      AVar11 = (ArrayPtr<const_char>)
               capnp::schema::Node::Reader::getDisplayName((Reader *)&partStr.branches.disposer);
      local_401[0] = 0x22;
      unique0x10001264 = AVar11;
      kj::strTree<char_const(&)[10],capnp::Text::Reader,char>
                (&local_3f0,(kj *)"import \"/",(char (*) [10])(local_401 + 1),(Reader *)local_401,
                 (char *)params_2);
      kj::StringTree::operator=((StringTree *)local_3b8,&local_3f0);
      kj::StringTree::~StringTree(&local_3f0);
    }
    else {
      iter._M_node = (_Base_ptr)proto._reader._40_8_;
      AVar11 = (ArrayPtr<const_char>)getUnqualifiedName(this,(Schema)proto._reader._40_8_);
      local_450 = AVar11;
      kj::strTree<capnp::Text::Reader>(&local_440,(Reader *)&local_450);
      kj::StringTree::operator=((StringTree *)local_3b8,&local_440);
      kj::StringTree::~StringTree(&local_440);
    }
    local_468 = capnp::schema::Node::Reader::getId((Reader *)&partStr.branches.disposer);
    local_460._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader>_>_>
         ::find((map<unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader>_>_>
                 *)&__range2,&local_468);
    bindings.disposer =
         (ArrayDisposer *)
         std::
         map<unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader>_>_>
         ::end((map<unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader>_>_>
                *)&__range2);
    bVar1 = std::operator!=(&local_460,(_Self *)&bindings.disposer);
    if (bVar1) {
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader>_>
               ::operator->(&local_460);
      kj::_::Mapper<capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader_&>::Mapper
                (&local_490,&ppVar8->second);
      local_4a8.scope = (Schema *)&this_local;
      local_4a8.this = this;
      local_4a8.method = method;
      kj::_::Mapper<capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader_&>::
      operator*<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnpc_capnp_c__:181:25)>
                ((Array<kj::StringTree> *)local_488,&local_490,&local_4a8);
      pSVar9 = kj::mv<kj::StringTree>((StringTree *)local_3b8);
      pieces = kj::mv<kj::Array<kj::StringTree>>((Array<kj::StringTree> *)local_488);
      kj::StringPtr::StringPtr((StringPtr *)&local_528,", ");
      kj::StringTree::StringTree(&local_518,pieces,(StringPtr)local_528);
      params_2 = (Maybe<capnp::InterfaceSchema::Method> *)0x28e38c;
      kj::strTree<kj::StringTree,char_const(&)[2],kj::StringTree,char_const(&)[2]>
                (&local_4e0,(kj *)pSVar9,(StringTree *)0x281089,(char (*) [2])&local_518,
                 (StringTree *)0x28e38c,in_R9);
      kj::StringTree::operator=((StringTree *)local_3b8,&local_4e0);
      kj::StringTree::~StringTree(&local_4e0);
      kj::StringTree::~StringTree(&local_518);
      kj::Array<kj::StringTree>::~Array((Array<kj::StringTree> *)local_488);
    }
    pSVar9 = kj::mv<kj::StringTree>((StringTree *)local_3b8);
    kj::ArrayBuilder<kj::StringTree>::add<kj::StringTree>
              ((ArrayBuilder<kj::StringTree> *)&part,pSVar9);
    kj::Vector<capnp::Schema>::removeLast((Vector<capnp::Schema> *)&scopeParts.builder.disposer);
    kj::StringTree::~StringTree((StringTree *)local_3b8);
  }
  kj::ArrayBuilder<kj::StringTree>::finish(&local_540,(ArrayBuilder<kj::StringTree> *)&part);
  kj::StringPtr::StringPtr((StringPtr *)&local_550,".");
  kj::StringTree::StringTree(__return_storage_ptr__,&local_540,(StringPtr)local_550);
  kj::Array<kj::StringTree>::~Array(&local_540);
  kj::ArrayBuilder<kj::StringTree>::~ArrayBuilder((ArrayBuilder<kj::StringTree> *)&part);
  std::
  map<unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader>_>_>
  ::~map((map<unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader>_>_>
          *)&__range2);
  kj::Vector<capnp::Schema>::~Vector((Vector<capnp::Schema> *)local_70);
  kj::Vector<capnp::Schema>::~Vector((Vector<capnp::Schema> *)&scopeParts.builder.disposer);
  return __return_storage_ptr__;
}

Assistant:

kj::StringTree nodeName(Schema target, Schema scope, schema::Brand::Reader brand,
                          kj::Maybe<InterfaceSchema::Method> method) {
    kj::Vector<Schema> targetPath;
    kj::Vector<Schema> scopeParts;

    targetPath.add(target);

    std::map<uint64_t, List<schema::Brand::Binding>::Reader> scopeBindings;
    for (auto scopeBrand: brand.getScopes()) {
      switch (scopeBrand.which()) {
        case schema::Brand::Scope::BIND:
          scopeBindings[scopeBrand.getScopeId()] = scopeBrand.getBind();
          break;
        case schema::Brand::Scope::INHERIT:
          // TODO(someday): We need to pay attention to INHERIT and be sure to explicitly override
          //   any bindings that are not inherited. This requires a way to determine which of our
          //   parent scopes have a non-empty parameter list.
          break;
      }
    }

    {
      Schema parent = target;
      while (parent.getProto().getScopeId() != 0) {
        parent = schemaLoader.get(parent.getProto().getScopeId());
        targetPath.add(parent);
      }
    }

    {
      Schema parent = scope;
      scopeParts.add(parent);
      while (parent.getProto().getScopeId() != 0) {
        parent = schemaLoader.get(parent.getProto().getScopeId());
        scopeParts.add(parent);
      }
    }

    // Remove common scope (unless it has been reparameterized).
    // TODO(someday):  This is broken in that we aren't checking for shadowing.
    while (!scopeParts.empty() && targetPath.size() > 1 &&
           scopeParts.back() == targetPath.back() &&
           scopeBindings.count(scopeParts.back().getProto().getId()) == 0) {
      scopeParts.removeLast();
      targetPath.removeLast();
    }

    auto parts = kj::heapArrayBuilder<kj::StringTree>(targetPath.size());
    while (!targetPath.empty()) {
      auto part = targetPath.back();
      auto proto = part.getProto();
      kj::StringTree partStr;
      if (proto.getScopeId() == 0) {
        partStr = kj::strTree("import \"/", proto.getDisplayName(), '\"');
      } else {
        partStr = kj::strTree(getUnqualifiedName(part));
      }

      auto iter = scopeBindings.find(proto.getId());
      if (iter != scopeBindings.end()) {
        auto bindings = KJ_MAP(binding, iter->second) {
          switch (binding.which()) {
            case schema::Brand::Binding::UNBOUND:
              return kj::strTree("AnyPointer");
            case schema::Brand::Binding::TYPE:
              return genType(binding.getType(), scope, method);
          }
          return kj::strTree("<unknown binding>");
        };
        partStr = kj::strTree(kj::mv(partStr), "(", kj::StringTree(kj::mv(bindings), ", "), ")");
      }

      parts.add(kj::mv(partStr));
      targetPath.removeLast();
    }

    return kj::StringTree(parts.finish(), ".");
  }